

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void Commands::Shutdown(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *arguments,Command_Source *from)

{
  undefined8 uVar1;
  string local_38 [32];
  Command_Source *local_18;
  Command_Source *from_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *arguments_local;
  
  local_18 = from;
  from_local = (Command_Source *)arguments;
  (*from->_vptr_Command_Source[2])();
  uVar1 = std::__cxx11::string::c_str();
  Console::Wrn("Server shut down by %s",uVar1);
  std::__cxx11::string::~string(local_38);
  eoserv_sig_abort = 1;
  return;
}

Assistant:

void Shutdown(const std::vector<std::string>& arguments, Command_Source* from)
{
	(void)arguments;

	Console::Wrn("Server shut down by %s", from->SourceName().c_str());
	eoserv_sig_abort = true;
}